

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundStatement.cpp
# Opt level: O0

void __thiscall hdc::CompoundStatement::~CompoundStatement(CompoundStatement *this)

{
  size_type sVar1;
  reference ppSVar2;
  int local_14;
  int i;
  CompoundStatement *this_local;
  
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00221b88;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>::size
                      (&this->statements);
    if (sVar1 <= (ulong)(long)local_14) break;
    ppSVar2 = std::vector<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>::operator[]
                        (&this->statements,(long)local_14);
    if (*ppSVar2 != (value_type)0x0) {
      (*((*ppSVar2)->super_ASTNode)._vptr_ASTNode[2])();
    }
    local_14 = local_14 + 1;
  }
  std::vector<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>::~vector(&this->statements);
  Statement::~Statement(&this->super_Statement);
  return;
}

Assistant:

CompoundStatement::~CompoundStatement() {
    for (int i = 0; i < statements.size(); ++i) {
        delete statements[i];
    }
}